

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockingQueue.h
# Opt level: O0

function<void_()> * __thiscall
Liby::BlockingQueue<std::function<void_()>_>::pop_front
          (function<void_()> *__return_storage_ptr__,BlockingQueue<std::function<void_()>_> *this)

{
  lock_guard<std::mutex> local_20;
  lock_guard<std::mutex> G_;
  BlockingQueue<std::function<void_()>_> *this_local;
  
  G_._M_device = &this->mutex_;
  std::lock_guard<std::mutex>::lock_guard(&local_20,&this->mutex_);
  pop_front_imp(__return_storage_ptr__,this);
  std::lock_guard<std::mutex>::~lock_guard(&local_20);
  return __return_storage_ptr__;
}

Assistant:

T pop_front() {
        std::lock_guard<std::mutex> G_(mutex_);
        return pop_front_imp();
    }